

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

InterpreterStackFrame *
Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
          (ScriptFunction *function,FunctionBody *executeFunction,JavascriptGenerator *generator,
          bool doProfile)

{
  code *pcVar1;
  Var *allocation_00;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  RegSlot RVar3;
  ScriptContext *this;
  Arguments *other;
  size_t sVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  FunctionBody *pFVar7;
  BailInSymbol *ptr;
  LoopHeader *local_168;
  TrackAllocData local_150;
  code *local_128;
  undefined8 local_120;
  TrackAllocData local_118;
  undefined8 *local_f0;
  RecyclableObject *invalidVar;
  InterpreterStackFrame *newInstance;
  undefined8 local_d8;
  TrackAllocData local_d0;
  Var *local_a8;
  Var *allocation;
  LoopHeader *loopHeaderArray;
  DWORD_PTR stackAddr;
  size_t varSizeInBytes;
  size_t varAllocCount;
  Setup setup;
  Arguments generatorArgs;
  ScriptContext *functionScriptContext;
  undefined1 auStack_20 [7];
  bool doProfile_local;
  JavascriptGenerator *generator_local;
  FunctionBody *executeFunction_local;
  ScriptFunction *function_local;
  
  _auStack_20 = (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)generator;
  generator_local = (JavascriptGenerator *)executeFunction;
  executeFunction_local = (FunctionBody *)function;
  this = RecyclableObject::GetScriptContext((RecyclableObject *)function);
  other = JavascriptGenerator::GetArguments((JavascriptGenerator *)_auStack_20);
  Arguments::Arguments((Arguments *)&setup.bailedOut,other);
  Setup::Setup((Setup *)&varAllocCount,(ScriptFunction *)executeFunction_local,
               (Arguments *)&setup.bailedOut,false,false,true);
  sVar4 = Setup::GetStackAllocationVarCount((Setup *)&varAllocCount);
  if (sVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x74d,"(setup.GetStackAllocationVarCount() == 0)",
                                "setup.GetStackAllocationVarCount() == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  varSizeInBytes = Setup::GetAllocationVarCount((Setup *)&varAllocCount);
  stackAddr = varSizeInBytes << 3;
  loopHeaderArray = (LoopHeader *)auStack_20;
  bVar2 = FunctionBody::GetHasAllocatedLoopHeaders((FunctionBody *)generator_local);
  if (bVar2) {
    local_168 = FunctionBody::GetLoopHeaderArrayPtr((FunctionBody *)generator_local);
  }
  else {
    local_168 = (LoopHeader *)0x0;
  }
  allocation = (Var *)local_168;
  pRVar6 = ScriptContext::GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_d0,(type_info *)&void*::typeinfo,stackAddr,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
             ,0x753);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_d0);
  newInstance = (InterpreterStackFrame *)Memory::Recycler::Alloc;
  local_d8 = 0;
  local_a8 = (Var *)new<Memory::Recycler>(8,pRVar6,0x446fd0,0);
  *local_a8 = (Var)0x0;
  if (local_a8 == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x754,"(allocation)","allocation");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = ScriptContext::GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_118,(type_info *)&void*::typeinfo,0x10,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
             ,0x758);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_118);
  local_128 = Memory::Recycler::AllocLeaf;
  local_120 = 0;
  local_f0 = (undefined8 *)new<Memory::Recycler>(8,pRVar6,0x446eb0,0);
  *local_f0 = 0;
  if (local_f0 == (undefined8 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x759,"(invalidVar)","invalidVar");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  memset(local_f0,0xfe,0x10);
  allocation_00 = local_a8;
  bVar2 = ParseableFunctionInfo::GetHasImplicitArgIns((ParseableFunctionInfo *)generator_local);
  invalidVar = (RecyclableObject *)
               Setup::InitializeAllocation
                         ((Setup *)&varAllocCount,allocation_00,(Var *)0x0,bVar2,doProfile,
                          (LoopHeader *)allocation,(DWORD_PTR)loopHeaderArray,local_f0);
  ByteCodeReader::Create((ByteCodeReader *)invalidVar,(FunctionBody *)generator_local,0);
  JavascriptGenerator::SetFrame
            ((JavascriptGenerator *)_auStack_20,(InterpreterStackFrame *)invalidVar,stackAddr);
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)executeFunction_local);
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
  pFVar7 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)executeFunction_local);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,BailInPhase,sourceContextId,functionId);
  if (bVar2) {
    pRVar6 = ScriptContext::GetRecycler(this);
    pFVar7 = FunctionProxy::GetFunctionBody((FunctionProxy *)generator_local);
    RVar3 = FunctionBody::GetLocalsCount(pFVar7);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_150,(type_info *)&JavascriptGenerator::BailInSymbol::typeinfo,0,(ulong)RVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
               ,0x770);
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_150);
    pFVar7 = FunctionProxy::GetFunctionBody((FunctionProxy *)generator_local);
    RVar3 = FunctionBody::GetLocalsCount(pFVar7);
    ptr = Memory::AllocateArray<Memory::Recycler,Js::JavascriptGenerator::BailInSymbol,false>
                    ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocLeafZero,0,(ulong)RVar3);
    Memory::WriteBarrierPtr<Js::JavascriptGenerator::BailInSymbol>::operator=
              ((WriteBarrierPtr<Js::JavascriptGenerator::BailInSymbol> *)
               &_auStack_20[1].
                super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                .super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.
                alloc,ptr);
  }
  return (InterpreterStackFrame *)invalidVar;
}

Assistant:

InterpreterStackFrame* InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(ScriptFunction* function, FunctionBody* executeFunction, JavascriptGenerator* generator, bool doProfile)
    {
        //
        // Allocate a new InterpreterStackFrame instance on the recycler heap.
        // It will live with the JavascriptGenerator object.
        //
        ScriptContext* functionScriptContext = function->GetScriptContext();
        Arguments generatorArgs = generator->GetArguments();
        InterpreterStackFrame::Setup setup(function, generatorArgs, false /* bailedOut */, false /* inlinee */, true /* isGeneratorFrame */);
        Assert(setup.GetStackAllocationVarCount() == 0);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t varSizeInBytes = varAllocCount * sizeof(Var);
        DWORD_PTR stackAddr = reinterpret_cast<DWORD_PTR>(&generator); // use any stack address from this frame to ensure correct debugging functionality
        LoopHeader* loopHeaderArray = executeFunction->GetHasAllocatedLoopHeaders() ? executeFunction->GetLoopHeaderArrayPtr() : nullptr;

        Var* allocation = RecyclerNewPlus(functionScriptContext->GetRecycler(), varSizeInBytes, Var);
        AnalysisAssert(allocation);
        InterpreterStackFrame* newInstance;
#if DBG
        // Allocate invalidVar on GC instead of stack since this InterpreterStackFrame will out live the current real frame
        Js::RecyclableObject* invalidVar = (Js::RecyclableObject*)RecyclerNewPlusLeaf(functionScriptContext->GetRecycler(), sizeof(Js::RecyclableObject), Var);
        AnalysisAssert(invalidVar);
        memset(reinterpret_cast<void*>(invalidVar), 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, nullptr, executeFunction->GetHasImplicitArgIns(), doProfile, loopHeaderArray, stackAddr
#if DBG
            , invalidVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);

        generator->SetFrame(newInstance, varSizeInBytes);

        // Moving this to when we create the generator instance in the first place would be nice.
        // But at that point the function might not have been parsed yet, so we don't have the locals count.
        // We are also allocating more space than we actually need because we shouldn't need to
        // reload all the symbols when bailing in.
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, function->GetFunctionBody()))
        {
            generator->bailInSymbolsTraceArray = (Js::JavascriptGenerator::BailInSymbol*) RecyclerNewArrayLeafZ(
                functionScriptContext->GetRecycler(), Js::JavascriptGenerator::BailInSymbol, executeFunction->GetFunctionBody()->GetLocalsCount()
            );
        }
#endif

        return newInstance;
    }